

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,FileDescriptorProto *file,
          pair<const_void_*,_int> value)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  LogMessage *pLVar4;
  Type *pTVar5;
  Type *pTVar6;
  Type *pTVar7;
  Type *pTVar8;
  int i;
  int iVar9;
  int i_2;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  pair<const_void_*,_int> value_02;
  pair<const_void_*,_int> value_03;
  pair<const_void_*,_int> value_04;
  pair<const_void_*,_int> value_05;
  pair<const_void_*,_int> value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  RepeatedPtrFieldBase *local_70;
  string path;
  
  value_local.first = value.first;
  value_local.second = value.second;
  bVar2 = InsertIfNotPresent<std::map<std::__cxx11::string,std::pair<void_const*,int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<void_const*,int>>>>>
                    (&this->by_name_,(file->name_).ptr_,&value_local);
  if (!bVar2) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&path,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&path,"File already exists in database: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,(file->name_).ptr_);
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&path);
    return false;
  }
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    path._M_dataplus._M_p = (pointer)&path.field_2;
    path._M_string_length = 0;
    path.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&path,(string *)(file->package_).ptr_);
    if (path._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&path);
    }
  }
  iVar9 = 0;
  do {
    if ((file->message_type_).super_RepeatedPtrFieldBase.current_size_ <= iVar9) {
      iVar9 = 0;
      goto LAB_005e79c1;
    }
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(file->message_type_).super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_90,&path,(pTVar5->name_).ptr_);
    value_00.second = value_local.second;
    value_00.first = value_local.first;
    value_00._12_4_ = 0;
    bVar2 = AddSymbol(this,&local_90,value_00);
    std::__cxx11::string::~string((string *)&local_90);
    if (!bVar2) break;
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(file->message_type_).super_RepeatedPtrFieldBase,iVar9);
    value_01.second = value_local.second;
    value_01.first = value_local.first;
    value_01._12_4_ = 0;
    bVar2 = AddNestedExtensions(this,pTVar5,value_01);
    iVar9 = iVar9 + 1;
  } while (bVar2);
  goto LAB_005e7a83;
  while( true ) {
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                       (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_90,&path,(pTVar6->name_).ptr_);
    value_02.second = value_local.second;
    value_02.first = value_local.first;
    value_02._12_4_ = 0;
    bVar2 = AddSymbol(this,&local_90,value_02);
    std::__cxx11::string::~string((string *)&local_90);
    iVar9 = iVar9 + 1;
    if (!bVar2) break;
LAB_005e79c1:
    if ((file->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= iVar9) {
      iVar9 = 0;
      goto LAB_005e7a14;
    }
  }
  goto LAB_005e7a83;
  while( true ) {
    pTVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                       (local_70,iVar9);
    std::operator+(&local_90,&path,(pTVar8->name_).ptr_);
    value_05.second = value_local.second;
    value_05.first = value_local.first;
    value_05._12_4_ = 0;
    bVar3 = AddSymbol(this,&local_90,value_05);
    std::__cxx11::string::~string((string *)&local_90);
    iVar9 = iVar9 + 1;
    if (!bVar3) break;
LAB_005e7ab1:
    iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
    bVar2 = iVar1 <= iVar9;
    if (iVar1 <= iVar9) break;
  }
  goto LAB_005e7a85;
  while( true ) {
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(file->extension_).super_RepeatedPtrFieldBase,iVar9);
    value_04.second = value_local.second;
    value_04.first = value_local.first;
    value_04._12_4_ = 0;
    bVar2 = AddExtension(this,pTVar7,value_04);
    iVar9 = iVar9 + 1;
    if (!bVar2) break;
LAB_005e7a14:
    if ((file->extension_).super_RepeatedPtrFieldBase.current_size_ <= iVar9) {
      local_70 = &(file->service_).super_RepeatedPtrFieldBase;
      iVar9 = 0;
      goto LAB_005e7ab1;
    }
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(file->extension_).super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_90,&path,(pTVar7->name_).ptr_);
    value_03.second = value_local.second;
    value_03.first = value_local.first;
    value_03._12_4_ = 0;
    bVar2 = AddSymbol(this,&local_90,value_03);
    std::__cxx11::string::~string((string *)&local_90);
    if (!bVar2) break;
  }
LAB_005e7a83:
  bVar2 = false;
LAB_005e7a85:
  std::__cxx11::string::~string((string *)&path);
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}